

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring_checked.hh
# Opt level: O0

void __thiscall doublechecked::Roaring::removeRangeClosed(Roaring *this,uint32_t min,uint32_t max)

{
  iterator __first;
  iterator __last;
  uint in_EDX;
  uint in_ESI;
  Roaring *in_RDI;
  undefined8 in_stack_ffffffffffffffc8;
  set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
  *in_stack_ffffffffffffffd8;
  
  roaring::Roaring::removeRangeClosed
            (in_RDI,(uint32_t)((ulong)in_stack_ffffffffffffffc8 >> 0x20),
             (uint32_t)in_stack_ffffffffffffffc8);
  if (in_ESI <= in_EDX) {
    __first = std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::
              lower_bound(in_stack_ffffffffffffffd8,(key_type *)in_RDI);
    __last = std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::
             upper_bound(in_stack_ffffffffffffffd8,(key_type *)in_RDI);
    std::set<unsigned_int,std::less<unsigned_int>,std::allocator<unsigned_int>>::erase_abi_cxx11_
              (in_stack_ffffffffffffffd8,(const_iterator)__first._M_node,
               (const_iterator)__last._M_node);
  }
  return;
}

Assistant:

void removeRangeClosed(uint32_t min, uint32_t max) {
        plain.removeRangeClosed(min, max);
        if (min <= max) {
            check.erase(check.lower_bound(min), check.upper_bound(max));
        }
    }